

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

double __thiscall soplex::SPxLPBase<double>::minAbsNzo(SPxLPBase<double> *this,bool unscaled)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  byte in_SIL;
  SPxLPBase<double> *in_RDI;
  double extraout_XMM0_Qa;
  double dVar4;
  double m_1;
  int i_1;
  double m;
  int i;
  double mini;
  int in_stack_ffffffffffffffbc;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar6;
  uint local_1c;
  double local_18;
  
  pdVar3 = (double *)infinity();
  local_18 = *pdVar3;
  if (((in_SIL & 1) == 0) || ((in_RDI->_isScaled & 1U) == 0)) {
    iVar1 = 0;
    while (iVar6 = iVar1, iVar2 = nCols((SPxLPBase<double> *)0x20226f), iVar1 < iVar2) {
      colVector(in_RDI,in_stack_ffffffffffffffbc);
      dVar4 = SVectorBase<double>::minAbs
                        ((SVectorBase<double> *)CONCAT44(iVar6,in_stack_ffffffffffffffd0));
      if (dVar4 < local_18) {
        local_18 = dVar4;
      }
      iVar1 = iVar6 + 1;
    }
  }
  else {
    local_1c = 0;
    while (uVar5 = local_1c, iVar1 = nCols((SPxLPBase<double> *)0x2021fe), (int)uVar5 < iVar1) {
      (*in_RDI->lp_scaler->_vptr_SPxScaler[0x13])(in_RDI->lp_scaler,in_RDI,(ulong)local_1c);
      if (extraout_XMM0_Qa < local_18) {
        local_18 = extraout_XMM0_Qa;
      }
      local_1c = local_1c + 1;
    }
  }
  return local_18;
}

Assistant:

inline
R SPxLPBase<R>::minAbsNzo(bool unscaled) const
{
   R mini = R(infinity);

   if(unscaled && _isScaled)
   {
      assert(lp_scaler != nullptr);

      for(int i = 0; i < nCols(); ++i)
      {
         R m = lp_scaler->getColMinAbsUnscaled(*this, i);

         if(m < mini)
            mini = m;
      }
   }
   else
   {
      for(int i = 0; i < nCols(); ++i)
      {
         R m = colVector(i).minAbs();

         if(m < mini)
            mini = m;
      }
   }

   assert(mini >= 0.0);

   return mini;
}